

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fad.h
# Opt level: O1

value_type __thiscall
FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
::dx(FadExpr<FadFuncSin<FadExpr<FadBinaryMul<FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_>,_FadCst<double>_>_>_>_>
     *this,int i)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  FadExpr<FadBinaryMul<Fad<double>,_Fad<double>_>_> *pFVar6;
  Fad<double> *pFVar7;
  Fad<double> *pFVar8;
  double *pdVar9;
  double *pdVar10;
  double dVar11;
  
  pFVar6 = (this->fadexpr_).expr_.fadexpr_.left_;
  pFVar7 = (pFVar6->fadexpr_).left_;
  pFVar8 = (pFVar6->fadexpr_).right_;
  pdVar10 = &pFVar7->defaultVal;
  if ((pFVar7->dx_).num_elts != 0) {
    pdVar10 = (pFVar7->dx_).ptr_to_data + i;
  }
  dVar1 = pFVar8->val_;
  pdVar9 = &pFVar8->defaultVal;
  if ((pFVar8->dx_).num_elts != 0) {
    pdVar9 = (pFVar8->dx_).ptr_to_data + i;
  }
  dVar2 = pFVar7->val_;
  dVar3 = *pdVar9;
  dVar4 = *pdVar10;
  dVar5 = (this->fadexpr_).expr_.fadexpr_.right_.constant_;
  dVar11 = cos(dVar1 * dVar2 * dVar5);
  return dVar11 * (dVar4 * dVar1 + dVar3 * dVar2) * dVar5;
}

Assistant:

value_type dx(int i) const { return fadexpr_.dx(i);}